

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

Qiniu_Uint64 Qiniu_Json_GetUInt64(Qiniu_Json *self,char *key,Qiniu_Uint64 defval)

{
  cJSON *pcVar1;
  ulong uVar2;
  
  if (self != (Qiniu_Json *)0x0) {
    pcVar1 = cJSON_GetObjectItem(self,key);
    if ((pcVar1 != (cJSON *)0x0) && (pcVar1->type == 3)) {
      uVar2 = (ulong)pcVar1->valuedouble;
      defval = (long)(pcVar1->valuedouble - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
    }
  }
  return defval;
}

Assistant:

Qiniu_Uint64 Qiniu_Json_GetUInt64(Qiniu_Json *self, const char *key, Qiniu_Uint64 defval)
{
    Qiniu_Json *sub;
    if (self == NULL)
    {
        return defval;
    }
    sub = cJSON_GetObjectItem(self, key);
    if (sub != NULL && sub->type == cJSON_Number)
    {
        return (Qiniu_Uint64)sub->valuedouble;
    }
    else
    {
        return defval;
    }
}